

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::rc::TextureLevelArray::allocLevel
          (TextureLevelArray *this,int level,TextureFormat *format,int width,int height,int depth)

{
  int height_00;
  int width_00;
  TextureFormat *format_00;
  bool bVar1;
  int iVar2;
  void *data;
  PixelBufferAccess local_58;
  int local_30;
  int local_2c;
  int dataSize;
  int depth_local;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  TextureLevelArray *pTStack_10;
  int level_local;
  TextureLevelArray *this_local;
  
  local_2c = depth;
  dataSize = height;
  depth_local = width;
  _height_local = format;
  format_local._4_4_ = level;
  pTStack_10 = this;
  iVar2 = tcu::TextureFormat::getPixelSize(format);
  local_30 = iVar2 * depth_local * dataSize * local_2c;
  bVar1 = hasLevel(this,format_local._4_4_);
  if (bVar1) {
    clearLevel(this,format_local._4_4_);
  }
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            (this->m_data + format_local._4_4_,(long)local_30);
  format_00 = _height_local;
  width_00 = depth_local;
  height_00 = dataSize;
  iVar2 = local_2c;
  data = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(this->m_data + format_local._4_4_);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_58,format_00,width_00,height_00,iVar2,data);
  memcpy(this->m_access + format_local._4_4_,&local_58,0x28);
  return;
}

Assistant:

void TextureLevelArray::allocLevel (int level, const tcu::TextureFormat& format, int width, int height, int depth)
{
	const int dataSize = format.getPixelSize()*width*height*depth;

	DE_ASSERT(deInBounds32(level, 0, DE_LENGTH_OF_ARRAY(m_data)));

	if (hasLevel(level))
		clearLevel(level);

	m_data[level].setStorage(dataSize);
	m_access[level] = PixelBufferAccess(format, width, height, depth, m_data[level].getPtr());
}